

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aatree.c
# Opt level: O0

Aatree * dodelete(DelInfo *info,Aatree *T,void **ret_value)

{
  int iVar1;
  Aatree *pAVar2;
  Aatree *pAVar3;
  Aatree *in_RDX;
  Aatree *in_RSI;
  undefined8 *in_RDI;
  Aatree *right;
  void **in_stack_ffffffffffffffd8;
  Aatree *local_8;
  
  local_8 = in_RSI;
  if (in_RSI != &nil) {
    in_RDI[2] = in_RSI;
    iVar1 = (*(code *)in_RDI[1])(*in_RDI,in_RSI->key);
    if (iVar1 < 0) {
      pAVar2 = dodelete((DelInfo *)in_RSI,in_RDX,in_stack_ffffffffffffffd8);
      in_RSI->left = pAVar2;
    }
    else {
      in_RDI[3] = in_RSI;
      pAVar2 = dodelete((DelInfo *)in_RSI,in_RDX,in_stack_ffffffffffffffd8);
      in_RSI->right = pAVar2;
    }
    if (((in_RSI == (Aatree *)in_RDI[2]) && ((Aatree *)in_RDI[3] != &nil)) &&
       (iVar1 = (*(code *)in_RDI[1])(*in_RDI,*(undefined8 *)(in_RDI[3] + 0x18)), iVar1 == 0)) {
      local_8 = in_RSI->right;
      *(undefined8 *)in_RDX = *(undefined8 *)(in_RDI[3] + 0x20);
      *(void **)(in_RDI[3] + 0x18) = in_RSI->key;
      *(void **)(in_RDI[3] + 0x20) = in_RSI->value;
      in_RDI[3] = &nil;
      al_free_with_context(in_RDI,(int)((ulong)in_RSI >> 0x20),(char *)in_RDX,(char *)local_8);
    }
    else if ((in_RSI->left->level < in_RSI->level + -1) ||
            (local_8 = in_RSI, in_RSI->right->level < in_RSI->level + -1)) {
      in_RSI->level = in_RSI->level + -1;
      if (in_RSI->level < in_RSI->right->level) {
        in_RSI->right->level = in_RSI->level;
      }
      pAVar2 = skew(in_RSI);
      pAVar3 = skew(pAVar2->right);
      pAVar2->right = pAVar3;
      pAVar3 = skew(pAVar2->right->right);
      pAVar2->right->right = pAVar3;
      local_8 = split(pAVar2);
      pAVar2 = split(local_8->right);
      local_8->right = pAVar2;
    }
  }
  return local_8;
}

Assistant:

static Aatree *dodelete(struct DelInfo *info, Aatree *T, void **ret_value)
{
   if (T == &nil)
      return T;

   /* Search down the tree and set pointers last and deleted. */
   info->last = T;
   if (info->compare(info->key, T->key) < 0) {
      T->left = dodelete(info, T->left, ret_value);
   }
   else {
      info->deleted = T;
      T->right = dodelete(info, T->right, ret_value);
   }

   /* At the bottom of the tree we remove the element if it is present. */
   if (T == info->last &&
      info->deleted != &nil &&
      info->compare(info->key, info->deleted->key) == 0)
   {
      Aatree *right = T->right;
      *ret_value = info->deleted->value;
      info->deleted->key = T->key;
      info->deleted->value = T->value;
      info->deleted = &nil;
      al_free(T);
      return right;
   }

   /* On the way back, we rebalance. */
   if (T->left->level < T->level - 1
      || T->right->level < T->level - 1)
   {
      T->level--;
      if (T->right->level > T->level) {
         T->right->level = T->level;
      }
      T = skew(T);
      T->right = skew(T->right);
      T->right->right = skew(T->right->right);
      T = split(T);
      T->right = split(T->right);
   }
   return T;
}